

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

void __thiscall QHeaderView::initializeSections(QHeaderView *this,int start,int end)

{
  QHash<int,_int> *this_00;
  QList<int> *this_01;
  uint uVar1;
  ResizeMode mode;
  QHeaderViewPrivate *this_02;
  Span *pSVar2;
  int iVar3;
  uint uVar4;
  Data<QHashPrivate::Node<int,_int>_> *pDVar5;
  pointer piVar6;
  int iVar7;
  size_t sVar8;
  int start_00;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  piter it;
  uint local_60;
  uint local_5c;
  void *local_58;
  uint *local_50;
  uint *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  (this_02->cachedSizeHint).wd = -1;
  (this_02->cachedSizeHint).ht = -1;
  if (this_02->headerMode == InitialNoSectionMemoryUsage) {
    uVar1 = (uint)this_02->countInNoSectionItemsMode;
  }
  else {
    uVar1 = (uint)(this_02->sectionItems).d.size;
  }
  start_00 = end + 1;
  if (start_00 < (int)uVar1) {
    QHeaderViewPrivate::removeSectionsFromSectionItems(this_02,start_00,uVar1 - 1);
    pDVar5 = (this_02->hiddenSectionSize).d;
    if ((pDVar5 != (Data<QHashPrivate::Node<int,_int>_> *)0x0) && (pDVar5->size != 0)) {
      this_00 = &this_02->hiddenSectionSize;
      if ((long)pDVar5->size < (long)(int)(uVar1 - start_00)) {
        iVar3 = start_00;
        while( true ) {
          local_58 = (void *)CONCAT44(local_58._4_4_,iVar3);
          if (this_02->headerMode == InitialNoSectionMemoryUsage) {
            iVar7 = (int)this_02->countInNoSectionItemsMode;
          }
          else {
            iVar7 = (int)(this_02->sectionItems).d.size;
          }
          if (iVar7 <= iVar3) break;
          QHash<int,_int>::removeImpl<int>(this_00,(int *)&local_58);
          iVar3 = (int)local_58 + 1;
        }
      }
      else {
        if (1 < (uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i) {
          pDVar5 = QHashPrivate::Data<QHashPrivate::Node<int,_int>_>::detached(pDVar5);
          this_00->d = pDVar5;
        }
        if (pDVar5->spans->offsets[0] == 0xff) {
          uVar9 = 1;
          do {
            sVar8 = uVar9;
            if (pDVar5->numBuckets == sVar8) {
              pDVar5 = (Data<QHashPrivate::Node<int,_int>_> *)0x0;
              sVar8 = 0;
              break;
            }
            uVar9 = sVar8 + 1;
          } while (pDVar5->spans[sVar8 >> 7].offsets[(uint)sVar8 & 0x7f] == 0xff);
          it.bucket = sVar8;
          it.d = pDVar5;
          if (pDVar5 == (Data<QHashPrivate::Node<int,_int>_> *)0x0 && sVar8 == 0) goto LAB_0054c7ed;
        }
        else {
          it.bucket = 0;
          it.d = pDVar5;
        }
        do {
          uVar9 = it.bucket;
          pDVar5 = it.d;
          pSVar2 = pDVar5->spans;
          if (end < *(int *)pSVar2[uVar9 >> 7].entries
                            [pSVar2[uVar9 >> 7].offsets[(uint)it.bucket & 0x7f]].storage.data) {
            it = (piter)QHash<int,_int>::erase(this_00,(const_iterator)it);
          }
          else {
            do {
              if (pDVar5->numBuckets - 1 == uVar9) {
                it = (piter)ZEXT816(0);
                break;
              }
              uVar9 = uVar9 + 1;
              it.bucket = uVar9;
              it.d = pDVar5;
            } while (pSVar2[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
          }
        } while ((it.d != (Data<QHashPrivate::Node<int,_int>_> *)0x0) || (it.bucket != 0));
      }
    }
  }
LAB_0054c7ed:
  if ((this_02->logicalIndices).d.size != 0) {
    this_01 = &this_02->logicalIndices;
    if (start_00 < (int)uVar1) {
      if (0 < (int)uVar1) {
        uVar9 = 0;
        iVar3 = 0;
        do {
          iVar7 = (this_02->logicalIndices).d.ptr[uVar9];
          if (iVar7 <= end) {
            piVar6 = QList<int>::data(this_01);
            piVar6[iVar3] = iVar7;
            piVar6 = QList<int>::data(&this_02->visualIndices);
            piVar6[iVar7] = iVar3;
            iVar3 = iVar3 + 1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
      }
      QList<int>::resize(this_01,(long)start_00);
      QList<int>::resize(&this_02->visualIndices,(long)start_00);
    }
    else {
      QList<int>::resize(this_01,(long)start_00);
      QList<int>::resize(&this_02->visualIndices,(long)start_00);
      if ((int)uVar1 <= end) {
        lVar10 = (long)(int)uVar1;
        do {
          piVar6 = QList<int>::data(this_01);
          piVar6[lVar10] = (int)lVar10;
          piVar6 = QList<int>::data(&this_02->visualIndices);
          piVar6[lVar10] = (int)lVar10;
          lVar10 = lVar10 + 1;
        } while (end + 1 != (int)lVar10);
      }
    }
  }
  mode = this_02->globalResizeMode;
  if (mode == ResizeToContents) {
    this_02->contentsSections = start_00;
  }
  else if (mode == Stretch) {
    this_02->stretchSections = start_00;
  }
  if ((int)uVar1 <= end) {
    QHeaderViewPrivate::createSectionItems(this_02,start,end,this_02->defaultSectionSize,mode);
  }
  if (this_02->headerMode == InitialNoSectionMemoryUsage) {
    uVar4 = (uint)this_02->countInNoSectionItemsMode;
  }
  else {
    uVar4 = (uint)(this_02->sectionItems).d.size;
  }
  if (uVar1 != uVar4) {
    local_50 = &local_5c;
    local_48 = &local_60;
    local_58 = (void *)0x0;
    local_60 = uVar4;
    local_5c = uVar1;
    QMetaObject::activate((QObject *)this,&staticMetaObject,6,&local_58);
  }
  QWidget::update((this_02->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::initializeSections(int start, int end)
{
    Q_D(QHeaderView);

    Q_ASSERT(start >= 0);
    Q_ASSERT(end >= 0);

    d->invalidateCachedSizeHint();
    int oldCount = d->sectionCount();

    if (end + 1 < d->sectionCount()) {
        int newCount = end + 1;
        d->removeSectionsFromSectionItems(newCount, d->sectionCount() - 1);
        if (!d->hiddenSectionSize.isEmpty()) {
            if (oldCount - newCount > d->hiddenSectionSize.size()) {
                for (int i = end + 1; i < d->sectionCount(); ++i)
                    d->hiddenSectionSize.remove(i);
            } else {
                QHash<int, int>::iterator it = d->hiddenSectionSize.begin();
                while (it != d->hiddenSectionSize.end()) {
                    if (it.key() > end)
                        it = d->hiddenSectionSize.erase(it);
                    else
                        ++it;
                }
            }
        }
    }

    int newSectionCount = end + 1;

    if (!d->logicalIndices.isEmpty()) {
        if (oldCount <= newSectionCount) {
            d->logicalIndices.resize(newSectionCount);
            d->visualIndices.resize(newSectionCount);
            for (int i = oldCount; i < newSectionCount; ++i) {
                d->logicalIndices[i] = i;
                d->visualIndices[i] = i;
            }
        } else {
            int j = 0;
            for (int i = 0; i < oldCount; ++i) {
                int v = d->logicalIndices.at(i);
                if (v < newSectionCount) {
                    d->logicalIndices[j] = v;
                    d->visualIndices[v] = j;
                    j++;
                }
            }
            d->logicalIndices.resize(newSectionCount);
            d->visualIndices.resize(newSectionCount);
        }
    }

    if (d->globalResizeMode == Stretch)
        d->stretchSections = newSectionCount;
    else if (d->globalResizeMode == ResizeToContents)
         d->contentsSections = newSectionCount;

    if (newSectionCount > oldCount)
        d->createSectionItems(start, end, d->defaultSectionSize, d->globalResizeMode);
    //Q_ASSERT(d->headerLength() == d->length);

    if (d->sectionCount() != oldCount)
        emit sectionCountChanged(oldCount,  d->sectionCount());
    d->viewport->update();
}